

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O2

Localtime * muduo::detail::findLocaltime(Data *data,Transition sentry,Comp comp)

{
  int iVar1;
  Transition *pTVar2;
  __normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
  _Var3;
  __normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
  _Var4;
  ulong uVar5;
  
  _Var3._M_current =
       (data->transitions).
       super__Vector_base<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  _Var4._M_current =
       (data->transitions).
       super__Vector_base<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current != _Var4._M_current) {
    uVar5 = (ulong)(((byte)~comp.compareGmt & 1) << 3);
    pTVar2 = (Transition *)&sentry.localtime;
    if ((comp.compareGmt & 1U) != 0) {
      pTVar2 = &sentry;
    }
    if (*(long *)((long)&(_Var3._M_current)->gmttime + uVar5) <= pTVar2->gmttime) {
      _Var3 = std::
              __lower_bound<__gnu_cxx::__normal_iterator<muduo::detail::Transition_const*,std::vector<muduo::detail::Transition,std::allocator<muduo::detail::Transition>>>,muduo::detail::Transition,__gnu_cxx::__ops::_Iter_comp_val<muduo::detail::Comp>>
                        (_Var3,_Var4,&sentry,(_Iter_comp_val<muduo::detail::Comp>)comp.compareGmt);
      pTVar2 = (data->transitions).
               super__Vector_base<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var3._M_current == pTVar2) {
        iVar1 = pTVar2[-1].localtimeIdx;
      }
      else {
        pTVar2 = (Transition *)&sentry.localtime;
        if ((comp.compareGmt & 1U) != 0) {
          pTVar2 = &sentry;
        }
        _Var4._M_current = _Var3._M_current + -1;
        if (pTVar2->gmttime == *(long *)((long)&(_Var3._M_current)->gmttime + uVar5)) {
          _Var4 = _Var3;
        }
        iVar1 = (_Var4._M_current)->localtimeIdx;
      }
      return (data->localtimes).
             super__Vector_base<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar1;
    }
  }
  return (data->localtimes).
         super__Vector_base<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_>.
         _M_impl.super__Vector_impl_data._M_start;
}

Assistant:

const Localtime* findLocaltime(const TimeZone::Data& data, Transition sentry, Comp comp)
{
  const Localtime* local = NULL;

  if (data.transitions.empty() || comp(sentry, data.transitions.front()))
  {
    // FIXME: should be first non dst time zone
    local = &data.localtimes.front();
  }
  else
  {
    vector<Transition>::const_iterator transI = lower_bound(data.transitions.begin(),
                                                            data.transitions.end(),
                                                            sentry,
                                                            comp);
    if (transI != data.transitions.end())
    {
      if (!comp.equal(sentry, *transI))
      {
        assert(transI != data.transitions.begin());
        --transI;
      }
      local = &data.localtimes[transI->localtimeIdx];
    }
    else
    {
      // FIXME: use TZ-env
      local = &data.localtimes[data.transitions.back().localtimeIdx];
    }
  }

  return local;
}